

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp
# Opt level: O3

IterateResult __thiscall
glcts::GeometryShaderLayeredRenderingFBONoAttachment::iterate
          (GeometryShaderLayeredRenderingFBONoAttachment *this)

{
  ostringstream *poVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  GLuint GVar7;
  undefined4 extraout_var;
  GLint *pGVar9;
  TestError *this_00;
  long lVar10;
  char *description;
  qpTestResult testResult;
  pointer_____offset_0x10___ *ppuVar11;
  TestContext *this_01;
  uint uVar12;
  long lVar13;
  bool bVar14;
  GLint nLayers;
  GLint height;
  GLint width;
  GLuint *local_1c0;
  GLuint *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar8;
  
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
               ,0xdc);
  }
  else if ((this->super_TestCaseBase).m_is_framebuffer_no_attachments_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"framebuffer_no_attachment, is not supported",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
               ,0xe1);
  }
  else {
    if ((this->super_TestCaseBase).m_is_shader_image_load_store_supported != false) {
      (**(code **)(lVar8 + 0x6d0))(1,&this->m_fbo_id);
      (**(code **)(lVar8 + 0x78))(0x8ca9,this->m_fbo_id);
      nLayers = -1;
      (**(code **)(lVar8 + 0x838))
                (0x8ca9,(this->super_TestCaseBase).m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS,&nLayers
                );
      dVar6 = (**(code **)(lVar8 + 0x800))();
      glu::checkError(dVar6,"Could not query a framebuffer object for the number of default layers!"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                      ,0xf2);
      if (nLayers == 0) {
        width = 0;
        height = 0;
        (**(code **)(lVar8 + 0x678))(0x8ca9,0x9310,0x80);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"Could not set the default framebuffer\'s width!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x103);
        (**(code **)(lVar8 + 0x838))(0x8ca9,0x9310,&width);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"Could not get the default framebuffer\'s width!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x105);
        (**(code **)(lVar8 + 0x678))(0x8ca9,0x9311,0x80);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"Could not set the default framebuffer\'s height!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x107);
        (**(code **)(lVar8 + 0x838))(0x8ca9,0x9311,&height);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"Could not get the default framebuffer\'s height!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x109);
        if ((width != 0x80) || (height != 0x80)) {
          local_1b0._0_8_ =
               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_1b0 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"Framebuffer\'s default width/height is not equal to",0x32);
          std::ostream::operator<<(poVar1,0x80);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\\",1);
          std::ostream::operator<<(poVar1,0x80);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," but is ",8);
          std::ostream::operator<<(poVar1,width);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\\",1);
          std::ostream::operator<<(poVar1,height);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_00d07184;
        }
        GVar7 = (**(code **)(lVar8 + 0x3c8))();
        this->m_po_id = GVar7;
        GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8b31);
        this->m_vs_id = GVar7;
        GVar7 = (**(code **)(lVar8 + 0x3f0))
                          ((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
        this->m_gs_id = GVar7;
        GVar7 = (**(code **)(lVar8 + 0x3f0))(0x8b30);
        this->m_fs_id = GVar7;
        bVar4 = TestCaseBase::buildProgram
                          (&this->super_TestCaseBase,this->m_po_id,GVar7,1,&m_fs_code,this->m_gs_id,
                           1,&m_gs_code,this->m_vs_id,1,&m_vs_code,(bool *)0x0);
        if (!bVar4) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,
                     "Could not create program object from a valid vertex/geometry/fragment shader code!"
                     ,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                     ,0x11e);
LAB_00d07289:
          ppuVar11 = &tcu::TestError::typeinfo;
          goto LAB_00d07330;
        }
        local_1c0 = &this->m_fbo_id;
        pGVar9 = (GLint *)operator_new__(0x100000);
        this->m_all_layers_data = pGVar9;
        lVar10 = 0;
        do {
          *(undefined8 *)((long)pGVar9 + lVar10) = 0xff;
          ((undefined8 *)((long)pGVar9 + lVar10))[1] = 0;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x100000);
        local_1b8 = &this->m_to_id;
        (**(code **)(lVar8 + 0x6f8))(1);
        (**(code **)(lVar8 + 0xb8))(0x8c1a,this->m_to_id);
        iVar5 = 4;
        (**(code **)(lVar8 + 0x1398))(0x8c1a,1,0x8d82,0x80,0x80,4);
        (**(code **)(lVar8 + 0x1350))(0x46180000,0x8c1a,0x2800);
        (**(code **)(lVar8 + 0x1350))(0x46180000,0x8c1a,0x2801);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"Error creating texture objects!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x132);
        (**(code **)(lVar8 + 0x1680))(this->m_po_id);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"Could not use program!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x136);
        bVar3 = 0;
        (**(code **)(lVar8 + 0x80))(0,this->m_to_id,0,1,0,0x88b9,0x8d82);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"Could not bind texture to image unit!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x13a);
        (**(code **)(lVar8 + 0x708))(1,&this->m_vao_id);
        (**(code **)(lVar8 + 0xd8))(this->m_vao_id);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"Could not create a vertex array object!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x140);
        (**(code **)(lVar8 + 0x1a00))(0,0,0x80,0x80);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        glu::checkError(dVar6,"glViewport() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                        ,0x144);
        pGVar9 = (GLint *)operator_new__(0x40000);
        this->m_layer_data = pGVar9;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        do {
          (**(code **)(lVar8 + 0x13c0))
                    (0x8c1a,0,0,0,0,0x80,0x80,4,0x8d99,0x1404,this->m_all_layers_data);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"glTexSubImage3D() call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                          ,0x15a);
          (**(code **)(lVar8 + 0x678))
                    (0x8ca9,(this->super_TestCaseBase).m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS,
                     iVar5);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,
                          "Could not set the default number of layers of a framebuffer object!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                          ,0x15f);
          (**(code **)(lVar8 + 0x838))
                    (0x8ca9,(this->super_TestCaseBase).m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS,
                     &nLayers);
          if (iVar5 != nLayers) {
            local_1b0._0_8_ =
                 ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            poVar1 = (ostringstream *)(local_1b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"FBO\'s default layers should be equal to ",0x28);
            std::ostream::operator<<(poVar1,4);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"but is ",7);
            std::ostream::operator<<(poVar1,nLayers);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_138);
            this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
            goto LAB_00d071a4;
          }
          (**(code **)(lVar8 + 0x538))(0,0,1);
          dVar6 = (**(code **)(lVar8 + 0x800))();
          glu::checkError(dVar6,"Could not execute a draw call!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                          ,0x170);
          (**(code **)(lVar8 + 0x78))(0x8ca8,*local_1c0);
          uVar12 = 0;
          do {
            (**(code **)(lVar8 + 0x6b8))(0x8ca8,0x8ce0,*local_1b8,0,uVar12);
            dVar6 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar6,"Could not bind texture as color attachment to framebuffer!",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                            ,0x179);
            iVar5 = (**(code **)(lVar8 + 0x170))(0x8ca8);
            if (iVar5 != 0x8cd5) {
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Read framebuffer is not complete!",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                         ,0x17d);
              goto LAB_00d07289;
            }
            (**(code **)(lVar8 + 0xdb8))(0x400);
            (**(code **)(lVar8 + 0x1220))(0,0,0x80,0x80,0x8d99,0x1404,this->m_layer_data);
            dVar6 = (**(code **)(lVar8 + 0x800))();
            glu::checkError(dVar6,
                            "Could not read back pixels from the texture bound to color attachment!"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
                            ,0x185);
            pGVar9 = this->m_layer_data;
            lVar10 = 0;
            lVar13 = 0;
            do {
              if ((((*(int *)((long)pGVar9 + lVar10) != 0) ||
                   (*(int *)((long)pGVar9 + lVar10 + 4) != 0xff)) ||
                  (*(int *)((long)pGVar9 + lVar10 + 8) != 0)) ||
                 (*(int *)((long)pGVar9 + lVar10 + 0xc) != 0)) {
                local_1b0._0_8_ =
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream(poVar1);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,"The test failed: Pixel ",0x17);
                std::ostream::operator<<(poVar1,(int)lVar13);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1," from layer ",0xc);
                std::ostream::operator<<(poVar1,uVar12);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1," is set to [",0xc);
                std::ostream::operator<<(poVar1,*(int *)((long)this->m_layer_data + lVar10));
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
                std::ostream::operator<<(poVar1,*(int *)((long)this->m_layer_data + lVar10 + 4));
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
                std::ostream::operator<<(poVar1,*(int *)((long)this->m_layer_data + lVar10 + 8));
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
                std::ostream::operator<<(poVar1,*(int *)((long)this->m_layer_data + lVar10 + 0xc));
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)poVar1,"] but should be equal to [",0x1a);
                std::ostream::operator<<(poVar1,0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
                std::ostream::operator<<(poVar1,0xff);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
                std::ostream::operator<<(poVar1,0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
                std::ostream::operator<<(poVar1,0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(poVar1);
                std::ios_base::~ios_base(local_138);
                bVar2 = 1;
                bVar4 = false;
                goto LAB_00d0708f;
              }
              lVar13 = lVar13 + 1;
              lVar10 = lVar10 + 0x10;
            } while (lVar13 != 0x4000);
            bVar4 = uVar12 < 3;
            uVar12 = uVar12 + 1;
          } while (bVar4);
          bVar4 = true;
          bVar2 = 0;
LAB_00d0708f:
          bVar14 = (bool)(bVar3 | bVar2);
          iVar5 = 0;
          (**(code **)(lVar8 + 0x6b8))(0x8ca8,0x8ce0,0);
          bVar3 = 1;
        } while (!bVar14);
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        if (bVar4) {
          description = "Pass";
          testResult = QP_TEST_RESULT_PASS;
          goto LAB_00d071b0;
        }
      }
      else {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Number of default layers should be equal to 0 but is ",0x35);
        std::ostream::operator<<(poVar1,nLayers);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00d07184:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base(local_138);
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      }
LAB_00d071a4:
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
LAB_00d071b0:
      tcu::TestContext::setTestResult(this_01,testResult,description);
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"shader_image_load_store, is not supported",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRenderingFBONoAttachment.cpp"
               ,0xe6);
  }
  ppuVar11 = &tcu::NotSupportedError::typeinfo;
LAB_00d07330:
  __cxa_throw(this_00,ppuVar11,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredRenderingFBONoAttachment::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check if required extensions are supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	if (!m_is_framebuffer_no_attachments_supported)
	{
		throw tcu::NotSupportedError("framebuffer_no_attachment, is not supported", "", __FILE__, __LINE__);
	}

	if (!m_is_shader_image_load_store_supported)
	{
		throw tcu::NotSupportedError("shader_image_load_store, is not supported", "", __FILE__, __LINE__);
	}

	/* Generate and bind a framebuffer object */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);

	/* Get the default number of layers of a newly created framebuffer object */
	glw::GLint nLayers = -1;

	gl.getFramebufferParameteriv(GL_DRAW_FRAMEBUFFER, m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS, &nLayers);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query a framebuffer object for the number of default layers!");

	/* check 14.2 test condition - if default number of layer equals 0 */
	if (nLayers != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Number of default layers should be equal to 0 but is "
						   << nLayers << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	/* Set the default resolution to 128x128 */
	glw::GLint width  = 0;
	glw::GLint height = 0;

	gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_WIDTH, m_width);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set the default framebuffer's width!");
	gl.getFramebufferParameteriv(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_WIDTH, &width);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get the default framebuffer's width!");
	gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_HEIGHT, m_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set the default framebuffer's height!");
	gl.getFramebufferParameteriv(GL_DRAW_FRAMEBUFFER, GL_FRAMEBUFFER_DEFAULT_HEIGHT, &height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not get the default framebuffer's height!");

	if (m_width != width || m_height != height)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Framebuffer's default width/height is not equal to" << m_width
						   << "\\" << m_height << " but is " << width << "\\" << height << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	/* Configure program object to be used for functional part of the test */
	m_po_id = gl.createProgram();

	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);

	if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &m_fs_code, m_gs_id, 1 /* part */, &m_gs_code, m_vs_id,
					  1 /* part */, &m_vs_code))
	{
		TCU_FAIL("Could not create program object from a valid vertex/geometry/fragment shader code!");
	}

	/* Configure texture objects and fill them with initial data */
	m_all_layers_data = new glw::GLint[m_n_layers * m_width * m_height * m_n_texture_components];

	for (int n = 0; n < m_n_layers * m_width * m_height; ++n)
	{
		m_all_layers_data[n * m_n_texture_components + 0] = 255;
		m_all_layers_data[n * m_n_texture_components + 1] = 0;
		m_all_layers_data[n * m_n_texture_components + 2] = 0;
		m_all_layers_data[n * m_n_texture_components + 3] = 0;
	}

	gl.genTextures(1, &m_to_id);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_id);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1 /* levels */, GL_RGBA32I, m_width, m_height, m_n_layers);
	gl.texParameterf(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameterf(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating texture objects!");

	/* Activate the test program object */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not use program!");

	/* Bind texture to image unit */
	gl.bindImageTexture(0, m_to_id, 0 /* level */, GL_TRUE, 0 /* layer */, GL_WRITE_ONLY, GL_RGBA32I);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind texture to image unit!");

	/* Generate & bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a vertex array object!");

	/* Set up the viewport */
	gl.viewport(0 /* x */, 0 /* y */, m_width /* width */, m_height /* height */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");

	/* Test 21.4 adjusts the behavior of the original tests. The test now needs to run
	 * in two iterations:
	 *
	 * a) Original behavior is left intact
	 * b) GL_FRAMEBUFFER_DEFAULT_LAYERS_EXT should be set to 0.
	 */
	glw::GLboolean test_failed = false;

	m_layer_data = new glw::GLint[m_width * m_height * m_n_texture_components];

	for (unsigned int n_test_iteration = 0; n_test_iteration < 2 && !test_failed; ++n_test_iteration)
	{
		const glw::GLint current_n_layers = (n_test_iteration == 1) ? 0 : m_n_layers;

		/* Reset render-target contents */
		gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0, /* level   */
						 0,						 /* xoffset */
						 0,						 /* yoffset */
						 0,						 /* zoffset */
						 m_width, m_height, m_n_layers, GL_RGBA_INTEGER, GL_INT, m_all_layers_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexSubImage3D() call failed.");

		/* Set the default number of layers to m_n_layers */
		gl.framebufferParameteri(GL_DRAW_FRAMEBUFFER, m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS, current_n_layers);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set the default number of layers of a framebuffer object!");

		gl.getFramebufferParameteriv(GL_DRAW_FRAMEBUFFER, m_glExtTokens.FRAMEBUFFER_DEFAULT_LAYERS, &nLayers);

		/* check if the reported value equals m_n_layers */
		if (current_n_layers != nLayers)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "FBO's default layers should be equal to " << m_n_layers
							   << "but is " << nLayers << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		/* Render! */
		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not execute a draw call!");

		/* Verify result texture data */
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);

		for (int n_layer = 0; n_layer < m_n_layers && !test_failed; ++n_layer)
		{
			gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_id, 0 /* level */, n_layer);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind texture as color attachment to framebuffer!");

			if (gl.checkFramebufferStatus(GL_READ_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
			{
				TCU_FAIL("Read framebuffer is not complete!");
			}

			gl.memoryBarrier(GL_FRAMEBUFFER_BARRIER_BIT);

			gl.readPixels(0 /* x */, 0 /* y */, m_width, m_height, GL_RGBA_INTEGER, GL_INT, m_layer_data);

			GLU_EXPECT_NO_ERROR(gl.getError(),
								"Could not read back pixels from the texture bound to color attachment!");

			/* Perform the verification */
			const int referenceColor[4] = { 0, 255, 0, 0 };

			for (int nPx = 0; nPx < m_width * m_height; ++nPx)
			{
				if (m_layer_data[nPx * m_n_texture_components + 0] != referenceColor[0] ||
					m_layer_data[nPx * m_n_texture_components + 1] != referenceColor[1] ||
					m_layer_data[nPx * m_n_texture_components + 2] != referenceColor[2] ||
					m_layer_data[nPx * m_n_texture_components + 3] != referenceColor[3])
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "The test failed: Pixel " << nPx << " from layer "
									   << n_layer << " is set to [" << m_layer_data[nPx * m_n_texture_components + 0]
									   << "," << m_layer_data[nPx * m_n_texture_components + 1] << ","
									   << m_layer_data[nPx * m_n_texture_components + 2] << ","
									   << m_layer_data[nPx * m_n_texture_components + 3] << "] but should be equal to ["
									   << referenceColor[0] << "," << referenceColor[1] << "," << referenceColor[2]
									   << "," << referenceColor[3] << ","
									   << "]" << tcu::TestLog::EndMessage;

					test_failed = true;
					break;
				} /* if (result pixel is invalid) */
			}	 /* for (all pixels) */
		}		  /* for (all layers) */

		/* Restore the FBO to no-attachment state for the next iteration */
		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, 0, 0, 0);

	} /* for (both iterations) */

	if (test_failed)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}